

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request_body.c
# Opt level: O2

ngx_int_t ngx_http_test_expect(ngx_http_request_t *r)

{
  undefined1 *puVar1;
  ngx_table_elt_t *pnVar2;
  ngx_int_t nVar3;
  ssize_t sVar4;
  ngx_connection_t *pnVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar6;
  
  uVar6 = *(ulong *)&r->field_0x468;
  if (((uint)uVar6 >> 0x15 & 1) != 0) {
    return 0;
  }
  pnVar2 = (r->headers_in).expect;
  if ((((pnVar2 != (ngx_table_elt_t *)0x0) && (1000 < r->http_version)) &&
      (*(ulong *)&r->field_0x468 = uVar6 | 0x200000, (pnVar2->value).len == 0xc)) &&
     (nVar3 = ngx_strncasecmp((pnVar2->value).data,(u_char *)"100-continue",0xc), nVar3 == 0)) {
    pnVar5 = r->connection;
    if ((pnVar5->log->log_level & 0x100) != 0) {
      ngx_log_error_core(8,pnVar5->log,0,"send 100 Continue",in_R8,in_R9,uVar6);
      pnVar5 = r->connection;
    }
    sVar4 = (*pnVar5->send)(pnVar5,(u_char *)"HTTP/1.1 100 Continue\r\n\r\n",0x19);
    if (sVar4 != 0x19) {
      puVar1 = &r->connection->field_0xd8;
      *(uint *)puVar1 = *(uint *)puVar1 | 0x1000;
      return -1;
    }
  }
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_test_expect(ngx_http_request_t *r)
{
    ngx_int_t   n;
    ngx_str_t  *expect;

    if (r->expect_tested
        || r->headers_in.expect == NULL
        || r->http_version < NGX_HTTP_VERSION_11)
    {
        return NGX_OK;
    }

    r->expect_tested = 1;

    expect = &r->headers_in.expect->value;

    if (expect->len != sizeof("100-continue") - 1
        || ngx_strncasecmp(expect->data, (u_char *) "100-continue",
                           sizeof("100-continue") - 1)
           != 0)
    {
        return NGX_OK;
    }

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "send 100 Continue");

    n = r->connection->send(r->connection,
                            (u_char *) "HTTP/1.1 100 Continue" CRLF CRLF,
                            sizeof("HTTP/1.1 100 Continue" CRLF CRLF) - 1);

    if (n == sizeof("HTTP/1.1 100 Continue" CRLF CRLF) - 1) {
        return NGX_OK;
    }

    /* we assume that such small packet should be send successfully */

    r->connection->error = 1;

    return NGX_ERROR;
}